

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QFixed>::appendInitialize(QArrayDataPointer<QFixed> *this,qsizetype newSize)

{
  QFixed *pQVar1;
  long in_RSI;
  QFixed *in_RDI;
  QFixed *e;
  QFixed *b;
  
  begin((QArrayDataPointer<QFixed> *)0x7883f0);
  pQVar1 = begin((QArrayDataPointer<QFixed> *)0x788409);
  std::uninitialized_value_construct<QFixed*>(pQVar1 + in_RSI,in_RDI);
  *(long *)(in_RDI + 4) = in_RSI;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }